

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseHessian
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  bool bVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  HMpsFF *pHVar7;
  int in_ECX;
  HighsLogOptions *in_RSI;
  long in_RDI;
  double dVar8;
  double coeff;
  bool is_nan;
  int entry;
  Parsekey key;
  size_t end;
  size_t begin;
  bool skip;
  HighsInt rowidx;
  HighsInt colidx;
  size_t end_coeff_name;
  size_t end_row_name;
  string coeff_name;
  string row_name;
  string col_name;
  string strline;
  string section_name;
  bool qmatrix;
  string *in_stack_fffffffffffffdd8;
  HMpsFF *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  istream *in_stack_fffffffffffffdf0;
  HMpsFF *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  HMpsFF *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  string *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string local_150;
  string local_130 [24];
  string *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  Parsekey in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [35];
  byte local_25;
  int local_24;
  HighsLogOptions *local_18;
  Parsekey local_4;
  
  local_25 = in_ECX == 10;
  local_24 = in_ECX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_48);
  if ((local_25 & 1) == 0) {
    if (local_24 == 0xb) {
      std::__cxx11::string::operator=(local_48,"QUADOBJ");
    }
  }
  else {
    std::__cxx11::string::operator=(local_48,"QMATRIX");
  }
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  std::__cxx11::string::string(local_d8);
  do {
    do {
      bVar1 = getMpsLine(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,(bool *)in_stack_fffffffffffffde0);
      if (!bVar1) {
        local_4 = kFail;
LAB_00463ac2:
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_48);
        return local_4;
      }
    } while ((in_stack_ffffffffffffff0c & 0x1000000) != 0);
    bVar1 = timeout(in_stack_fffffffffffffde0);
    if (bVar1) {
      local_4 = kTimeout;
      goto LAB_00463ac2;
    }
    in_stack_fffffffffffffef4 =
         checkFirstWord((HMpsFF *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        (string *)0x0,(size_t *)0x0,
                        (size_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffee8);
    if (in_stack_fffffffffffffef4 != kNone) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogDev(local_18,kInfo,"readMPS: Read %s OK\n",uVar4);
      local_4 = in_stack_fffffffffffffef4;
      goto LAB_00463ac2;
    }
    HVar2 = getColIdx(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0));
    pHVar7 = in_stack_fffffffffffffde0;
    for (in_stack_fffffffffffffef0 = 0; in_stack_fffffffffffffde0 = pHVar7,
        in_stack_fffffffffffffef0 < 2; in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 + 1) {
      std::__cxx11::string::operator=(local_b8,"");
      first_word(in_stack_fffffffffffffe58,(size_t)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe50 = local_130;
      std::__cxx11::string::operator=(local_b8,in_stack_fffffffffffffe50);
      std::__cxx11::string::~string(in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe58 =
           (string *)
           first_word_end(in_stack_fffffffffffffe38,
                          CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pHVar7,(char *)in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffde0 = pHVar7;
      if (bVar1) break;
      std::__cxx11::string::operator=(local_d8,"");
      first_word(in_stack_fffffffffffffe58,(size_t)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe38 = &local_150;
      std::__cxx11::string::operator=(local_d8,(string *)in_stack_fffffffffffffe38);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffe38);
      in_stack_fffffffffffffde0 =
           (HMpsFF *)
           first_word_end(in_stack_fffffffffffffe38,
                          CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      in_stack_fffffffffffffe37 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pHVar7,(char *)in_stack_fffffffffffffdd8);
      if ((bool)in_stack_fffffffffffffe37) {
        trim((string *)pHVar7,in_stack_fffffffffffffdd8);
        trim((string *)pHVar7,in_stack_fffffffffffffdd8);
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        highsLogUser(local_18,kError,"%s has no coefficient for entry \"%s\" in column \"%s\"\n",
                     uVar4,uVar5,uVar6);
        local_4 = kFail;
        goto LAB_00463ac2;
      }
      HVar3 = getColIdx(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                        SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0));
      dVar8 = getValue((HMpsFF *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                       (string *)in_stack_fffffffffffffe28,(bool *)in_stack_fffffffffffffe20,
                       (HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        if ((local_25 & 1) == 0) {
          in_stack_fffffffffffffde8 = (string *)(in_RDI + 0x2d0);
          std::make_tuple<int&,int&,double&>
                    ((int *)in_stack_fffffffffffffde8,(int *)pHVar7,
                     (double *)in_stack_fffffffffffffdd8);
          std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
          ::push_back((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       *)pHVar7,(value_type *)in_stack_fffffffffffffdd8);
        }
        else if (HVar2 <= HVar3) {
          in_stack_fffffffffffffdf0 = (istream *)(in_RDI + 0x2d0);
          std::make_tuple<int&,int&,double&>
                    ((int *)in_stack_fffffffffffffde8,(int *)pHVar7,
                     (double *)in_stack_fffffffffffffdd8);
          std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
          ::push_back((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       *)pHVar7,(value_type *)in_stack_fffffffffffffdd8);
        }
      }
      pHVar7 = (HMpsFF *)std::__cxx11::string::length();
      if (in_stack_fffffffffffffde0 == pHVar7) break;
      pHVar7 = in_stack_fffffffffffffde0;
    }
  } while( true );
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseHessian(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QUADOBJ or QMATRIX
  // section according to keyword
  const bool qmatrix = keyword == HMpsFF::Parsekey::kQmatrix;
  std::string section_name;
  if (qmatrix) {
    section_name = "QMATRIX";
  } else if (keyword == HMpsFF::Parsekey::kQuadobj) {
    section_name = "QUADOBJ";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt colidx, rowidx;

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index from the name
    colidx = getColIdx(col_name);
    assert(colidx >= 0 && colidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      rowidx = getColIdx(row_name);
      assert(rowidx >= 0 && rowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qmatrix) {
          // QMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (rowidx >= colidx)
            q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
        } else {
          // QSECTION and QUADOBJ has the lower triangle of the
          // Hessian
          q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
          //          if (rowidx != colidx)
          //            q_entries.push_back(std::make_tuple(colidx, rowidx,
          //            coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}